

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O0

void testPosixIO(char *inFile,char *outFile,vector<char,_std::allocator<char>_> *inBuffer)

{
  int __fd;
  int __fd_00;
  ostream *poVar1;
  reference pvVar2;
  ulong local_40;
  size_t chunk;
  size_t bytesLeft;
  size_t inFileSize;
  int out;
  int in;
  vector<char,_std::allocator<char>_> *inBuffer_local;
  char *outFile_local;
  char *inFile_local;
  
  __fd = open(inFile,0);
  if (__fd < 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Can\'t open input file: ");
    poVar1 = std::operator<<(poVar1,inFile);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    __fd_00 = open(outFile,0x41,0x1b6);
    if (__fd_00 < 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Can\'t open output file: ");
      poVar1 = std::operator<<(poVar1,outFile);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      chunk = lseek(__fd,0,2);
      lseek(__fd,0,0);
      local_40 = std::vector<char,_std::allocator<char>_>::size(inBuffer);
      for (; chunk != 0; chunk = chunk - local_40) {
        if (chunk < local_40) {
          local_40 = chunk;
        }
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](inBuffer,0);
        read(__fd,pvVar2,local_40);
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](inBuffer,0);
        write(__fd_00,pvVar2,local_40);
      }
      close(__fd_00);
      close(__fd);
    }
  }
  return;
}

Assistant:

void testPosixIO(const char* inFile, const char* outFile, std::vector<char>& inBuffer)
{
    int in = ::open(inFile, O_RDONLY | O_BINARY);
    if (in < 0)
    {
        std::cout << "Can't open input file: " << inFile << std::endl;
        return;
    }

    int out = ::open(outFile, O_CREAT | O_WRONLY | O_BINARY, 0666);
    if (out < 0)
    {
        std::cout << "Can't open output file: " << outFile << std::endl;
        return;
    }

    size_t inFileSize = ::lseek(in, 0, SEEK_END);
    ::lseek(in, 0, SEEK_SET);

    for (size_t bytesLeft = inFileSize, chunk = inBuffer.size(); bytesLeft > 0; bytesLeft -= chunk)
    {
        if (bytesLeft < chunk)
        {
            chunk = bytesLeft;
        }

        ::read(in, &inBuffer[0], chunk);
        ::write(out, &inBuffer[0], chunk);
    }

    ::close(out);
    ::close(in);
}